

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

void ssh2_write_pubkey(FILE *fp,char *comment,void *v_pub_blob,int pub_len,int keytype)

{
  char cVar1;
  char *ptr;
  int iVar2;
  int n;
  int iVar3;
  char buf [5];
  
  if (keytype == 10) {
    ptr = ssh2_pubkey_openssh_str_internal(comment,v_pub_blob,pub_len);
    fprintf((FILE *)fp,"%s\n",ptr);
    safefree(ptr);
    return;
  }
  if (keytype != 9) {
    __assert_fail("false && \"Bad key type in ssh2_write_pubkey\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                  0x6b6,"void ssh2_write_pubkey(FILE *, const char *, const void *, int, int)");
  }
  fwrite("---- BEGIN SSH2 PUBLIC KEY ----\n",0x20,1,(FILE *)fp);
  if (comment != (char *)0x0) {
    fwrite("Comment: \"",10,1,(FILE *)fp);
    do {
      cVar1 = *comment;
      if ((cVar1 == '\"') || (cVar1 == '\\')) {
        fputc(0x5c,(FILE *)fp);
        cVar1 = *comment;
      }
      else if (cVar1 == '\0') goto LAB_00114224;
      fputc((int)cVar1,(FILE *)fp);
      comment = comment + 1;
    } while( true );
  }
LAB_00114239:
  iVar2 = 0;
  for (iVar3 = 0; n = pub_len - iVar3, n != 0 && iVar3 <= pub_len; iVar3 = iVar3 + n) {
    if (2 < n) {
      n = 3;
    }
    base64_encode_atom((uchar *)((long)iVar3 + (long)v_pub_blob),n,buf);
    buf[4] = '\0';
    fputs(buf,(FILE *)fp);
    if (iVar2 < 0xf) {
      iVar2 = iVar2 + 1;
    }
    else {
      fputc(10,(FILE *)fp);
      iVar2 = 0;
    }
  }
  if (0 < iVar2) {
    fputc(10,(FILE *)fp);
  }
  fwrite("---- END SSH2 PUBLIC KEY ----\n",0x1e,1,(FILE *)fp);
  return;
LAB_00114224:
  fwrite("\"\n",2,1,(FILE *)fp);
  goto LAB_00114239;
}

Assistant:

void ssh2_write_pubkey(FILE *fp, const char *comment,
                       const void *v_pub_blob, int pub_len,
                       int keytype)
{
    unsigned char *pub_blob = (unsigned char *)v_pub_blob;

    if (keytype == SSH_KEYTYPE_SSH2_PUBLIC_RFC4716) {
        const char *p;
        int i, column;

        fprintf(fp, "---- BEGIN SSH2 PUBLIC KEY ----\n");

        if (comment) {
            fprintf(fp, "Comment: \"");
            for (p = comment; *p; p++) {
                if (*p == '\\' || *p == '\"')
                    fputc('\\', fp);
                fputc(*p, fp);
            }
            fprintf(fp, "\"\n");
        }

        i = 0;
        column = 0;
        while (i < pub_len) {
            char buf[5];
            int n = (pub_len - i < 3 ? pub_len - i : 3);
            base64_encode_atom(pub_blob + i, n, buf);
            i += n;
            buf[4] = '\0';
            fputs(buf, fp);
            if (++column >= 16) {
                fputc('\n', fp);
                column = 0;
            }
        }
        if (column > 0)
            fputc('\n', fp);

        fprintf(fp, "---- END SSH2 PUBLIC KEY ----\n");
    } else if (keytype == SSH_KEYTYPE_SSH2_PUBLIC_OPENSSH) {
        char *buffer = ssh2_pubkey_openssh_str_internal(comment,
                                                        v_pub_blob, pub_len);
        fprintf(fp, "%s\n", buffer);
        sfree(buffer);
    } else {
        unreachable("Bad key type in ssh2_write_pubkey");
    }
}